

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O0

void __thiscall ON_Matrix::SetDiagonal(ON_Matrix *this,double *d)

{
  int iVar1;
  double **ppdVar2;
  int local_28;
  int i;
  int n;
  double **this_m;
  double *d_local;
  ON_Matrix *this_local;
  
  Zero(this);
  if (d != (double *)0x0) {
    ppdVar2 = ThisM(this);
    iVar1 = MinCount(this);
    this_m = (double **)d;
    for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
      ppdVar2[local_28][local_28] = (double)*this_m;
      this_m = this_m + 1;
    }
  }
  return;
}

Assistant:

void ON_Matrix::SetDiagonal( const double* d )
{
  Zero();
  if (d) 
  {
    double** this_m = ThisM();
    const int n = MinCount();
    int i;
    for ( i = 0; i < n; i++ )
    {
      this_m[i][i] = *d++;
    }
  }
}